

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O1

void __thiscall
QTextCursorPrivate::selectedTableCells
          (QTextCursorPrivate *this,int *firstRow,int *numRows,int *firstColumn,int *numColumns)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long in_FS_OFFSET;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *firstRow = -1;
  *firstColumn = -1;
  *numRows = -1;
  *numColumns = -1;
  if (this->position != this->anchor) {
    QTextDocumentPrivate::frameAt(this->priv,this->position);
    lVar6 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
    if (lVar6 != 0) {
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextTable::cellAt((QTextTable *)local_48,(int)lVar6);
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextTable::cellAt((QTextTable *)local_58,(int)lVar6);
      if ((local_48._0_8_ != local_58._0_8_) || (local_48._8_4_ != local_58._8_4_)) {
        iVar1 = QTextTableCell::row((QTextTableCell *)local_48);
        iVar2 = QTextTableCell::row((QTextTableCell *)local_58);
        if (iVar1 < iVar2) {
          iVar2 = iVar1;
        }
        *firstRow = iVar2;
        iVar1 = QTextTableCell::column((QTextTableCell *)local_48);
        iVar2 = QTextTableCell::column((QTextTableCell *)local_58);
        if (iVar1 < iVar2) {
          iVar2 = iVar1;
        }
        *firstColumn = iVar2;
        iVar1 = QTextTableCell::row((QTextTableCell *)local_48);
        iVar3 = QTextTableCell::rowSpan((QTextTableCell *)local_48);
        iVar4 = QTextTableCell::row((QTextTableCell *)local_58);
        iVar5 = QTextTableCell::rowSpan((QTextTableCell *)local_58);
        iVar2 = iVar5 + iVar4;
        if (iVar5 + iVar4 < iVar3 + iVar1) {
          iVar2 = iVar3 + iVar1;
        }
        *numRows = iVar2 - *firstRow;
        iVar1 = QTextTableCell::column((QTextTableCell *)local_48);
        iVar3 = QTextTableCell::columnSpan((QTextTableCell *)local_48);
        iVar4 = QTextTableCell::column((QTextTableCell *)local_58);
        iVar5 = QTextTableCell::columnSpan((QTextTableCell *)local_58);
        iVar2 = iVar5 + iVar4;
        if (iVar5 + iVar4 < iVar3 + iVar1) {
          iVar2 = iVar3 + iVar1;
        }
        *numColumns = iVar2 - *firstColumn;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextCursorPrivate::selectedTableCells(int *firstRow, int *numRows, int *firstColumn, int *numColumns) const
{
    *firstRow = -1;
    *firstColumn = -1;
    *numRows = -1;
    *numColumns = -1;

    if (position == anchor)
        return;

    QTextTable *t = qobject_cast<QTextTable *>(priv->frameAt(position));
    if (!t)
        return;

    QTextTableCell cell_pos = t->cellAt(position);
    QTextTableCell cell_anchor = t->cellAt(adjusted_anchor);

    Q_ASSERT(cell_anchor.isValid());

    if (cell_pos == cell_anchor)
        return;

    *firstRow = qMin(cell_pos.row(), cell_anchor.row());
    *firstColumn = qMin(cell_pos.column(), cell_anchor.column());
    *numRows = qMax(cell_pos.row() + cell_pos.rowSpan(), cell_anchor.row() + cell_anchor.rowSpan()) - *firstRow;
    *numColumns = qMax(cell_pos.column() + cell_pos.columnSpan(), cell_anchor.column() + cell_anchor.columnSpan()) - *firstColumn;
}